

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void re2c::prtChOrHex(ostream *o,uint32_t c)

{
  opt_t *poVar1;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  if (((poVar1->encoding).type_ != EBCDIC) && (c - 0x20 < 0x5f || c - 9 < 5)) {
    std::operator<<(o,'\'');
    prtCh(o,c);
    std::operator<<(o,'\'');
    return;
  }
  prtHex(o,c);
  return;
}

Assistant:

void prtChOrHex(std::ostream& o, uint32_t c)
{
	if (opts->encoding.type () != Enc::EBCDIC
		&& (is_print (c) || is_space (c)))
	{
		o << '\'';
		prtCh(o, c);
		o << '\'';
	}
	else
	{
		prtHex(o, c);
	}
}